

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBuiltin_db_errlog(jx9_context *pCtx,int argc,jx9_value **argv)

{
  long *plVar1;
  SyBlob *pErr;
  unqlite_vm *pVm;
  jx9_value **argv_local;
  int argc_local;
  jx9_context *pCtx_local;
  
  plVar1 = (long *)jx9_context_user_data(pCtx);
  jx9_result_string(pCtx,*(char **)(*plVar1 + 0xc0),*(int *)(*plVar1 + 200));
  return 0;
}

Assistant:

static int unqliteBuiltin_db_errlog(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_vm *pVm;
	SyBlob *pErr;
	
	SXUNUSED(argc); /* cc warning */
	SXUNUSED(argv);

	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Point to the error log */
	pErr = &pVm->pDb->sErr;
	/* Return the log */
	jx9_result_string(pCtx,(const char *)SyBlobData(pErr),(int)SyBlobLength(pErr));
	return JX9_OK;
}